

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

void GetLine(FILE *file,string *str_line)

{
  scoped_array<char> sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  scoped_array<char> *this;
  scoped_array<char> line;
  undefined1 local_64 [4];
  scoped_array<char> local_60;
  string local_58;
  string local_38;
  
  if (file == (FILE *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_60.array_._0_4_ = 2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GetLine","");
    poVar6 = Logger::Start(ERR,&local_38,0xad,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xad);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"file",4);
    std::operator<<(poVar6," == NULL \n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    this = &local_60;
  }
  else {
    pcVar3 = (char *)operator_new__(0xa00000);
    local_60.array_ = pcVar3;
    pcVar4 = fgets(pcVar3,0xa00000,(FILE *)file);
    if (pcVar4 != (char *)0x0) {
      sVar5 = strlen(pcVar3);
      iVar2 = (int)sVar5;
      pcVar3 = scoped_array<char>::operator[](&local_60,(long)(iVar2 + -1));
      if (*pcVar3 == '\n') {
        pcVar3 = scoped_array<char>::operator[](&local_60,(long)(iVar2 + -1));
        *pcVar3 = '\0';
        if (1 < iVar2) {
          pcVar3 = scoped_array<char>::operator[](&local_60,(ulong)(iVar2 - 2));
          if (*pcVar3 == '\r') {
            pcVar3 = scoped_array<char>::operator[](&local_60,(ulong)(iVar2 - 2));
            *pcVar3 = '\0';
          }
        }
      }
      else {
        local_64 = (undefined1  [4])0x3;
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GetLine","");
        poVar6 = Logger::Start(FATAL,&local_38,0xb2,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "Encountered a too-long line:                   Cannot find the \'\\n\' char.                     Please check the data."
                   ,0x74);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p);
        }
        Logger::~Logger((Logger *)local_64);
      }
      sVar1.array_ = local_60.array_;
      pcVar3 = (char *)str_line->_M_string_length;
      strlen(local_60.array_);
      std::__cxx11::string::_M_replace((ulong)str_line,0,pcVar3,(ulong)sVar1.array_);
      if (local_60.array_ != (char *)0x0) {
        operator_delete__(local_60.array_);
      }
      return;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_64 = (undefined1  [4])0x2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GetLine","");
    poVar6 = Logger::Start(ERR,&local_38,0xaf,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0xaf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"fgets(line.get(), kMaxLineSize, file)",0x25);
    std::operator<<(poVar6," == NULL \n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    this = (scoped_array<char> *)local_64;
  }
  Logger::~Logger((Logger *)this);
  abort();
}

Assistant:

inline void GetLine(FILE *file, std::string &str_line) {
  CHECK_NOTNULL(file);
  scoped_array<char> line(new char[kMaxLineSize]);
  CHECK_NOTNULL(fgets(line.get(), kMaxLineSize, file));
  int read_len = strlen(line.get());
  if (line[read_len-1] != '\n') {
    LOG(FATAL) << "Encountered a too-long line: \
                  Cannot find the '\\n' char.   \
                  Please check the data.";
  } else {
    line[read_len-1] = '\0';
    // Handle the format in DOS and Windows
    if (read_len > 1 && line[read_len-2] == '\r') {
      line[read_len-2] = '\0';
    }
  }
  str_line.assign(line.get());
}